

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_strcpy(char *dst,int dst_sz,char *src)

{
  code *pcVar1;
  int iVar2;
  char *pcVar3;
  int local_30;
  int32_t num;
  int32_t max;
  int len;
  char *src_local;
  int dst_sz_local;
  char *dst_local;
  
  if (dst == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x58,"dst");
    pcVar1 = (code *)swi(3);
    pcVar3 = (char *)(*pcVar1)();
    return pcVar3;
  }
  if (src != (char *)0x0) {
    iVar2 = sx_strlen(src);
    local_30 = dst_sz + -1;
    if (iVar2 < local_30) {
      local_30 = iVar2;
    }
    if (0 < local_30) {
      memcpy(dst,src,(long)local_30);
    }
    dst[local_30] = '\0';
    return dst + local_30;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                    0x59,"src");
  pcVar1 = (code *)swi(3);
  pcVar3 = (char *)(*pcVar1)();
  return pcVar3;
}

Assistant:

char* sx_strcpy(char* SX_RESTRICT dst, int dst_sz, const char* SX_RESTRICT src)
{
    sx_assert(dst);
    sx_assert(src);

    const int len = sx_strlen(src);
    const int32_t max = dst_sz - 1;
    const int32_t num = (len < max ? len : max);
    if (num > 0) {
        sx_memcpy(dst, src, num);
    }
    dst[num] = '\0';

    return &dst[num];
}